

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointPoint.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChLinkPointPoint::IntLoadConstraint_C
          (ChLinkPointPoint *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  element_type *peVar1;
  element_type *peVar2;
  long lVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined8 in_XMM1_Qb;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  
  uVar8 = (ulong)off_L;
  iVar7 = (*(this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar7 == '\0') {
    return;
  }
  peVar1 = (this->mnodeA).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar2 = (this->mnodeB).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar14 = (*(double *)&(peVar1->super_ChNodeFEAbase).field_0x20 -
           *(double *)&(peVar2->super_ChNodeFEAbase).field_0x20) * c;
  dVar12 = (*(double *)&peVar1->field_0x28 - *(double *)&peVar2->field_0x28) * c;
  dVar10 = (*(double *)&peVar1->field_0x30 - *(double *)&peVar2->field_0x30) * c;
  if (do_clamp) {
    auVar6._8_8_ = in_XMM1_Qb;
    auVar6._0_8_ = recovery_clamp;
    auVar5._8_8_ = 0x8000000000000000;
    auVar5._0_8_ = 0x8000000000000000;
    auVar9 = vxorpd_avx512vl(auVar6,auVar5);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar14;
    auVar5 = vmaxsd_avx(auVar15,auVar9);
    auVar5 = vminsd_avx(auVar5,auVar6);
    dVar14 = auVar5._0_8_;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar12;
    auVar5 = vmaxsd_avx(auVar13,auVar9);
    auVar5 = vminsd_avx(auVar5,auVar6);
    dVar12 = auVar5._0_8_;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar10;
    auVar5 = vmaxsd_avx(auVar11,auVar9);
    auVar5 = vminsd_avx(auVar5,auVar6);
    dVar10 = auVar5._0_8_;
  }
  lVar3 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)uVar8 < lVar3) {
    pdVar4 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar4[uVar8] = dVar14 + pdVar4[uVar8];
    uVar8 = (ulong)(off_L + 1);
    if ((long)uVar8 < lVar3) {
      pdVar4[uVar8] = dVar12 + pdVar4[uVar8];
      uVar8 = (ulong)(off_L + 2);
      if ((long)uVar8 < lVar3) {
        pdVar4[uVar8] = dVar10 + pdVar4[uVar8];
        return;
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChLinkPointPoint::IntLoadConstraint_C(const unsigned int off_L,  // offset in Qc residual
                                           ChVectorDynamic<>& Qc,     // result: the Qc residual, Qc += c*C
                                           const double c,            // a scaling factor
                                           bool do_clamp,             // apply clamping to c*C?
                                           double recovery_clamp      // value for min/max clamping of c*C
                                           ) {
    if (!IsActive())
        return;

    ChVector<> res = mnodeA->GetPos() - mnodeB->GetPos();
    ChVector<> cres = res * c;

    if (do_clamp) {
        cres.x() = ChMin(ChMax(cres.x(), -recovery_clamp), recovery_clamp);
        cres.y() = ChMin(ChMax(cres.y(), -recovery_clamp), recovery_clamp);
        cres.z() = ChMin(ChMax(cres.z(), -recovery_clamp), recovery_clamp);
    }
    Qc(off_L + 0) += cres.x();
    Qc(off_L + 1) += cres.y();
    Qc(off_L + 2) += cres.z();
}